

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::timerEvent(QMenu *this,QTimerEvent *e)

{
  QMenuPrivate *this_00;
  QMenuScroller *pQVar1;
  QArrayData *pQVar2;
  TimerId TVar3;
  long lVar4;
  
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  pQVar1 = this_00->scroll;
  if (pQVar1 == (QMenuScroller *)0x0) {
    TVar3 = *(TimerId *)(e + 0x10);
  }
  else {
    TVar3 = *(TimerId *)(e + 0x10);
    if ((pQVar1->scrollTimer).m_id == TVar3) {
      QMenuPrivate::scrollMenu(this_00,(uint)pQVar1->scrollDirection,false,false);
      if (this_00->scroll->scrollFlags != '\0') {
        return;
      }
      QBasicTimer::stop();
      return;
    }
  }
  if ((this_00->delayState).timer.m_id != TVar3) {
    if ((this_00->sloppyState).m_time.m_id == TVar3) {
      QMenuSloppyState::timeout(&this_00->sloppyState);
      return;
    }
    if (((this_00->searchBufferTimer).m_id == TVar3) &&
       ((this_00->searchBuffer).d.ptr != (char16_t *)0x0)) {
      pQVar2 = &((this_00->searchBuffer).d.d)->super_QArrayData;
      (this_00->searchBuffer).d.d = (Data *)0x0;
      (this_00->searchBuffer).d.ptr = (char16_t *)0x0;
      (this_00->searchBuffer).d.size = 0;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
          return;
        }
      }
    }
    return;
  }
  if (this_00->currentAction != (QAction *)0x0) {
    QAction::menuObject();
    lVar4 = QMetaObject::cast((QObject *)&staticMetaObject);
    if (lVar4 == 0) {
      return;
    }
  }
  (this_00->delayState).action = (QAction *)0x0;
  QBasicTimer::stop();
  QBasicTimer::stop();
  internalDelayedPopup(this);
  return;
}

Assistant:

void
QMenu::timerEvent(QTimerEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && d->scroll->scrollTimer.timerId() == e->timerId()) {
        d->scrollMenu((QMenuPrivate::QMenuScroller::ScrollDirection)d->scroll->scrollDirection);
        if (d->scroll->scrollFlags == QMenuPrivate::QMenuScroller::ScrollNone)
            d->scroll->scrollTimer.stop();
    } else if (d->delayState.timer.timerId() == e->timerId()) {
        if (d->currentAction && !d->currentAction->menu())
            return;
        d->delayState.stop();
        d->sloppyState.stopTimer();
        internalDelayedPopup();
    } else if (d->sloppyState.isTimerId(e->timerId())) {
        d->sloppyState.timeout();
    } else if (d->searchBufferTimer.timerId() == e->timerId()) {
        d->searchBuffer.clear();
    }
}